

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead_common.c
# Opt level: O0

void ascon_aead_generate_tag(ascon_aead_ctx_t *ctx,uint8_t *tag,size_t tag_len)

{
  ulong in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  uint_fast8_t remaining;
  byte local_28;
  ulong local_18;
  uint8_t *local_10;
  
  local_10 = in_RSI;
  for (local_18 = in_RDX; 0x10 < local_18; local_18 = local_18 - 0x10) {
    bigendian_encode_u64(local_10,*(uint64_t *)(in_RDI + 0x18));
    bigendian_encode_u64(local_10 + 8,*(uint64_t *)(in_RDI + 0x20));
    ascon_permutation_12((ascon_sponge_t *)0x102f0f);
    local_10 = local_10 + 0x10;
  }
  local_28 = (byte)local_18;
  if (8 < local_18) {
    local_28 = 8;
  }
  bigendian_encode_varlen(local_10,*(uint64_t *)(in_RDI + 0x18),local_28);
  bigendian_encode_varlen
            (local_10 + (int)(uint)local_28,*(uint64_t *)(in_RDI + 0x20),(byte)local_18 - local_28);
  return;
}

Assistant:

void
ascon_aead_generate_tag(ascon_aead_ctx_t* const ctx,
                        uint8_t* tag,
                        size_t tag_len)
{
    while (tag_len > ASCON_AEAD_TAG_MIN_SECURE_LEN)
    {
        // All bytes before the last 16
        // Note: converting the sponge uint64_t to bytes to then check them as
        // uint64_t is required, as the conversion to bytes ensures the
        // proper byte order regardless of the platform native endianness.
        bigendian_encode_u64(tag, ctx->bufstate.sponge.x3);
        bigendian_encode_u64(tag + sizeof(uint64_t), ctx->bufstate.sponge.x4);
        ascon_permutation_12(&ctx->bufstate.sponge);
        tag_len -= ASCON_AEAD_TAG_MIN_SECURE_LEN;
        tag += ASCON_AEAD_TAG_MIN_SECURE_LEN;
    }
    // The last 16 or fewer bytes (also 0)
    uint_fast8_t remaining = (uint_fast8_t) MIN(sizeof(uint64_t), tag_len);
    bigendian_encode_varlen(tag, ctx->bufstate.sponge.x3, remaining);
    tag += remaining;
    // The last 8 or fewer bytes (also 0)
    tag_len -= remaining;
    bigendian_encode_varlen(tag, ctx->bufstate.sponge.x4, (uint_fast8_t) tag_len);
}